

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_capi_appender.cpp
# Opt level: O2

void TestAppenderError(duckdb_appender *appender,string *expected)

{
  undefined1 uVar1;
  void *local_e8;
  SourceLineInfo local_e0;
  char *error;
  BinaryExpr<const_char_*const_&,_const_std::nullptr_t_&> local_c8;
  AssertionHandler catchAssertionHandler;
  StringRef local_50;
  StringRef local_40;
  
  error = (char *)duckdb_appender_error(*appender);
  local_c8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x433f41;
  local_c8.super_ITransientExpression.m_isBinaryExpression = true;
  local_c8.super_ITransientExpression.m_result = false;
  local_c8.super_ITransientExpression._10_6_ = 0;
  local_e0.file =
       "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/capi/test_capi_appender.cpp"
  ;
  local_e0.line = 0x23;
  Catch::StringRef::StringRef(&local_40,"error != nullptr");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_c8,&local_e0,local_40,Normal);
  local_e8 = (void *)0x0;
  local_e0.file = (char *)&error;
  Catch::ExprLhs<char_const*const&>::operator!=
            (&local_c8,(ExprLhs<char_const*const&> *)&local_e0,&local_e8);
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_c8.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_c8.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  local_c8.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x433f41;
  local_c8.super_ITransientExpression.m_isBinaryExpression = true;
  local_c8.super_ITransientExpression.m_result = false;
  local_c8.super_ITransientExpression._10_6_ = 0;
  local_e0.file =
       "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/test/api/capi/test_capi_appender.cpp"
  ;
  local_e0.line = 0x24;
  Catch::StringRef::StringRef(&local_50,"duckdb::StringUtil::Contains(error, expected)");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,(StringRef *)&local_c8,&local_e0,local_50,Normal);
  std::__cxx11::string::string((string *)&local_c8,error,(allocator *)&local_e8);
  uVar1 = duckdb::StringUtil::Contains((string *)&local_c8,(string *)expected);
  local_e0.file = (char *)CONCAT71(local_e0.file._1_7_,uVar1);
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler,(ExprLhs<bool> *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c8);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  return;
}

Assistant:

void TestAppenderError(duckdb_appender &appender, const string &expected) {
	auto error = duckdb_appender_error(appender);
	REQUIRE(error != nullptr);
	REQUIRE(duckdb::StringUtil::Contains(error, expected));
}